

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O2

_Bool av1_resize_vert_dir_c
                (uint8_t *intbuf,uint8_t *output,int out_stride,int height,int height2,int width2,
                int start_col)

{
  uint8_t *arr;
  uint8_t *output_00;
  long lVar1;
  
  arr = (uint8_t *)aom_malloc((long)height);
  output_00 = (uint8_t *)aom_malloc((long)height2);
  if (output_00 != (uint8_t *)0x0 && arr != (uint8_t *)0x0) {
    for (lVar1 = (long)start_col; lVar1 < width2; lVar1 = lVar1 + 1) {
      fill_col_to_arr(intbuf + lVar1,width2,height,arr);
      down2_symeven(arr,height,output_00,0);
      fill_arr_to_col(output + lVar1,out_stride,height2,output_00);
    }
  }
  aom_free(arr);
  aom_free(output_00);
  return output_00 != (uint8_t *)0x0 && arr != (uint8_t *)0x0;
}

Assistant:

bool av1_resize_vert_dir_c(uint8_t *intbuf, uint8_t *output, int out_stride,
                           int height, int height2, int width2, int start_col) {
  bool mem_status = true;
  uint8_t *arrbuf = (uint8_t *)aom_malloc(sizeof(*arrbuf) * height);
  uint8_t *arrbuf2 = (uint8_t *)aom_malloc(sizeof(*arrbuf2) * height2);
  if (arrbuf == NULL || arrbuf2 == NULL) {
    mem_status = false;
    goto Error;
  }

  for (int i = start_col; i < width2; ++i) {
    fill_col_to_arr(intbuf + i, width2, height, arrbuf);
    down2_symeven(arrbuf, height, arrbuf2, 0);
    fill_arr_to_col(output + i, out_stride, height2, arrbuf2);
  }

Error:
  aom_free(arrbuf);
  aom_free(arrbuf2);
  return mem_status;
}